

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O3

Move io::parseMove(string *input,Board *pos)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char *pcVar5;
  pointer pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  ulong uVar9;
  pointer pMVar10;
  Move MVar11;
  MoveList movelist;
  MoveList local_60;
  vector<board::Move,_std::allocator<board::Move>_> local_48;
  
  if (3 < input->_M_string_length) {
    pcVar5 = (input->_M_dataplus)._M_p;
    cVar1 = *pcVar5;
    cVar2 = pcVar5[1];
    cVar3 = pcVar5[2];
    cVar4 = pcVar5[3];
    search::movegen::generateAll(&local_60,pos,false);
    std::vector<board::Move,_std::allocator<board::Move>_>::vector(&local_48,&local_60.moves);
    if (local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      MVar11.value = 0;
      MVar11.score = 0;
      uVar9 = 0;
      bVar7 = true;
    }
    else {
      pcVar6 = (input->_M_dataplus)._M_p;
      bVar7 = true;
      pMVar10 = local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        MVar11 = *pMVar10;
        if (((MVar11.value & 0x7fU) == ((int)cVar1 + cVar2 * 10) - 0x236U) &&
           (((uint)((ulong)MVar11 >> 7) & 0x7f) == ((int)cVar3 + cVar4 * 10) - 0x236U)) {
          if (((ulong)MVar11 >> 0x14 & 0xf) == 0) goto LAB_001320ff;
          if (4 < input->_M_string_length) {
            switch(board::Board::PIECE_NO_TEAM[(uint)((ulong)MVar11 >> 0x14) & 0xf]) {
            case 2:
              if (pcVar6[4] == 'n') {
LAB_001320ff:
                uVar9 = (ulong)MVar11 & 0xffffffff00000000;
                bVar7 = false;
                goto LAB_0013210e;
              }
              break;
            case 3:
              if (pcVar6[4] == 'b') goto LAB_001320ff;
              break;
            case 4:
              if (pcVar6[4] == 'r') goto LAB_001320ff;
              break;
            case 5:
              if (pcVar6[4] == 'q') goto LAB_001320ff;
            }
          }
        }
        pMVar10 = pMVar10 + 1;
      } while (pMVar10 !=
               local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
               super__Vector_impl_data._M_finish);
      uVar9 = (ulong)MVar11 & 0xffffffff00000000;
    }
LAB_0013210e:
    if (local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.moves.super__Vector_base<board::Move,_std::allocator<board::Move>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.moves.
                            super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.moves.
                            super__Vector_base<board::Move,_std::allocator<board::Move>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (!bVar7) {
      return (Move)(uVar9 | (ulong)MVar11 & 0xffffffff);
    }
  }
  puVar8 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar8 = 0;
  __cxa_throw(puVar8,&int::typeinfo,0);
}

Assistant:

board::Move io::parseMove(const std::string& input, board::Board& pos)
{
    if (input.length() > 3) {
        int from = board::Board::FR2SQ(input.at(0) - 'a', input.at(1) - '1');
        int to = board::Board::FR2SQ(input[2] - 'a', input[3] - '1');
        int promoted = 0;
        search::MoveList movelist = search::movegen::generateAll(pos, false);
        for (board::Move move : movelist.getMoves()) {
            if (board::Move::FROMSQ(move.getValue()) == from && board::Move::TOSQ(move.getValue()) == to) {
                promoted = board::Move::PROMOTED(move.getValue());
                if (promoted == board::EMPTY) {
                    return move;
                }
                if (input.length() > 4) {
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WR && input.at(4) == 'r') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WB && input.at(4) == 'b') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WQ && input.at(4) == 'q') {
                        return move;
                    }
                    if (board::Board::PIECE_NO_TEAM[promoted] == board::WN && input.at(4) == 'n') {
                        return move;
                    }
                }
            }
        }
    }
    throw 0;
}